

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O1

int LZ4_compressHC_limitedOutput_withStateHC
              (void *state,char *src,char *dst,int srcSize,int maxDstSize)

{
  int iVar1;
  LZ4HC_CCtx_internal *hcstate;
  
  if (((ulong)state & 7) != 0 || state == (void *)0x0) {
    return 0;
  }
  memset(state,0,0x40030);
  *(undefined2 *)((long)state + 0x40024) = 9;
  iVar1 = LZ4_compress_HC_extStateHC_fastReset(state,src,dst,srcSize,maxDstSize,0);
  return iVar1;
}

Assistant:

int LZ4_compressHC_limitedOutput_withStateHC (void* state, const char* src, char* dst, int srcSize, int maxDstSize) { return LZ4_compress_HC_extStateHC (state, src, dst, srcSize, maxDstSize, 0); }